

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O0

void __thiscall
VectorFormatter<CustomUintFormatter<6,false>>::
Ser<SizeComputer,std::vector<unsigned_long,std::allocator<unsigned_long>>>
          (VectorFormatter<CustomUintFormatter<6,_false>_> *this,SizeComputer *s,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *v)

{
  bool bVar1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_RSI;
  long in_FS_OFFSET;
  CustomUintFormatter<6,_false> *unaff_retaddr;
  value_type_conflict5 *elem;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range2;
  const_iterator __end0;
  const_iterator __begin0;
  CustomUintFormatter<6,_false> formatter;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffffa8;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  *in_stack_ffffffffffffffb8;
  unsigned_long in_stack_fffffffffffffff0;
  SizeComputer *s_00;
  
  s_00 = *(SizeComputer **)(in_FS_OFFSET + 0x28);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(in_stack_ffffffffffffffa8);
  WriteCompactSize((SizeComputer *)in_stack_ffffffffffffffb8,(uint64_t)in_RSI);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin(in_RSI);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end(in_RSI);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                      (in_stack_ffffffffffffffb8,
                       (__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                        *)in_RSI);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    in_stack_ffffffffffffffb8 =
         (__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
          *)__gnu_cxx::
            __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
            ::operator*((__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                         *)in_stack_ffffffffffffffa8);
    CustomUintFormatter<6,false>::Ser<SizeComputer,unsigned_long>
              (unaff_retaddr,s_00,in_stack_fffffffffffffff0);
    __gnu_cxx::
    __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
    ::operator++((__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                  *)in_stack_ffffffffffffffa8);
  }
  if (*(SizeComputer **)(in_FS_OFFSET + 0x28) == s_00) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Ser(Stream& s, const V& v)
    {
        Formatter formatter;
        WriteCompactSize(s, v.size());
        for (const typename V::value_type& elem : v) {
            formatter.Ser(s, elem);
        }
    }